

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_models.c
# Opt level: O0

void s390_init_cpu_model(uc_struct *uc,uc_cpu_s390x cpu_model)

{
  uint local_18;
  int i;
  uc_cpu_s390x cpu_model_local;
  uc_struct *uc_local;
  
  init_ignored_base_feat();
  s390_init_feat_bitmap(qemu_max_cpu_feat_init,qemu_max_cpu_feat);
  for (local_18 = 0; local_18 < 0x24; local_18 = local_18 + 1) {
    s390_init_feat_bitmap
              (s390_cpu_defs[(int)local_18].base_init,s390_cpu_defs[(int)local_18].base_feat);
    s390_init_feat_bitmap
              (s390_cpu_defs[(int)local_18].default_init,s390_cpu_defs[(int)local_18].default_feat);
    s390_init_feat_bitmap
              (s390_cpu_defs[(int)local_18].full_init,s390_cpu_defs[(int)local_18].full_feat);
  }
  s390_set_qemu_cpu_model(0x2964,'\r','\x02',s390_init_cpu_model::qemu_latest_init);
  if (cpu_model < UC_CPU_S390X_QEMU) {
    s390_base_cpu_model_class_init((uc_struct_conflict14 *)uc,uc->cpu->cc,s390_cpu_defs + cpu_model)
    ;
    s390_cpu_model_class_init((uc_struct_conflict14 *)uc,uc->cpu->cc,s390_cpu_defs + cpu_model);
    s390_cpu_model_initfn(uc->cpu);
  }
  else if (cpu_model == UC_CPU_S390X_MAX) {
    s390_max_cpu_model_class_init((uc_struct_conflict14 *)uc,uc->cpu->cc,(void *)0x0);
    s390_max_cpu_model_initfn(uc->cpu);
  }
  else if (cpu_model == UC_CPU_S390X_QEMU) {
    s390_qemu_cpu_model_class_init((uc_struct_conflict14 *)uc,uc->cpu->cc,(void *)0x0);
    s390_qemu_cpu_model_initfn(uc->cpu);
  }
  return;
}

Assistant:

void s390_init_cpu_model(uc_engine *uc, uc_cpu_s390x cpu_model)
{
    static const S390FeatInit qemu_latest_init = { S390_FEAT_LIST_QEMU_LATEST };
    int i;

    init_ignored_base_feat();

    /* init all bitmaps from gnerated data initially */
    s390_init_feat_bitmap(qemu_max_cpu_feat_init, qemu_max_cpu_feat);
    for (i = 0; i < ARRAY_SIZE(s390_cpu_defs); i++) {
        s390_init_feat_bitmap(s390_cpu_defs[i].base_init,
                              s390_cpu_defs[i].base_feat);
        s390_init_feat_bitmap(s390_cpu_defs[i].default_init,
                              s390_cpu_defs[i].default_feat);
        s390_init_feat_bitmap(s390_cpu_defs[i].full_init,
                              s390_cpu_defs[i].full_feat);
    }

    /* initialize the qemu model with latest definition */
    s390_set_qemu_cpu_model(QEMU_MAX_CPU_TYPE, QEMU_MAX_CPU_GEN,
                            QEMU_MAX_CPU_EC_GA, qemu_latest_init);

    if (cpu_model < ARRAY_SIZE(s390_cpu_defs)) {
        s390_base_cpu_model_class_init(uc, uc->cpu->cc, (void *) &s390_cpu_defs[cpu_model]);
        s390_cpu_model_class_init(uc, uc->cpu->cc, (void *) &s390_cpu_defs[cpu_model]);
        s390_cpu_model_initfn(uc->cpu);
    } else if (cpu_model == UC_CPU_S390X_MAX) {
        s390_max_cpu_model_class_init(uc, uc->cpu->cc, NULL);
        s390_max_cpu_model_initfn(uc->cpu);
    } else if (cpu_model == UC_CPU_S390X_QEMU) {
        s390_qemu_cpu_model_class_init(uc, uc->cpu->cc, NULL);
        s390_qemu_cpu_model_initfn(uc->cpu);
    }

}